

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O1

void __thiscall
adios2::core::Stream::Stream
          (Stream *this,string *name,Mode mode,Comm *comm,string *configFile,string *ioInConfigFile,
          string *hostLanguage)

{
  ADIOS *this_00;
  pointer pcVar1;
  IO *pIVar2;
  undefined1 local_59;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50;
  
  (this->m_ADIOS).super___shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58 = &(this->m_ADIOS).super___shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<adios2::core::ADIOS,std::allocator<adios2::core::ADIOS>,std::__cxx11::string_const&,adios2::helper::Comm,std::__cxx11::string_const&>
            (local_58,(ADIOS **)this,(allocator<adios2::core::ADIOS> *)&local_59,configFile,comm,
             hostLanguage);
  this_00 = (this->m_ADIOS).super___shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  pcVar1 = (ioInConfigFile->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + ioInConfigFile->_M_string_length);
  pIVar2 = ADIOS::DeclareIO(this_00,&local_50,Auto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this->m_IO = pIVar2;
  this->m_Engine = (Engine *)0x0;
  (this->m_Name)._M_dataplus._M_p = (pointer)&(this->m_Name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_Name,pcVar1,pcVar1 + name->_M_string_length);
  this->m_Mode = mode;
  (this->m_EngineType)._M_dataplus._M_p = (pointer)&(this->m_EngineType).field_2;
  (this->m_EngineType)._M_string_length = 0;
  (this->m_EngineType).field_2._M_local_buf[0] = '\0';
  this->m_FirstStep = true;
  this->m_StepStatus = false;
  if ((mode == ReadRandomAccess) || (mode == Read)) {
    CheckOpen(this);
  }
  return;
}

Assistant:

Stream::Stream(const std::string &name, const Mode mode, helper::Comm comm,
               const std::string configFile, const std::string ioInConfigFile,
               const std::string hostLanguage)
: m_ADIOS(std::make_shared<ADIOS>(configFile, std::move(comm), hostLanguage)),
  m_IO(&m_ADIOS->DeclareIO(ioInConfigFile)), m_Name(name), m_Mode(mode)
{
    if ((mode == adios2::Mode::Read) || (mode == adios2::Mode::ReadRandomAccess))
    {
        CheckOpen();
    }
}